

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_176::GUFAOptimizer::visitExpression(GUFAOptimizer *this,Expression *curr)

{
  Id IVar1;
  byte bVar2;
  ulong uVar3;
  uintptr_t uVar4;
  PassRunner *pPVar5;
  Module *wasm;
  bool bVar6;
  MemoryOrder MVar7;
  Type TVar8;
  Expression *pEVar9;
  uintptr_t uVar10;
  byte *pbVar11;
  PassOptions *options;
  undefined1 local_50 [8];
  PossibleContents contents;
  
  uVar3 = (curr->type).id;
  if (uVar3 < 2) {
    return;
  }
  IVar1 = curr->_id;
  pEVar9 = curr;
  while (IVar1 == RefAsId) {
    if (1 < *(int *)(pEVar9 + 1) - 1U) goto LAB_0089915f;
    pEVar9 = (Expression *)pEVar9[1].type.id;
    IVar1 = pEVar9->_id;
  }
  if ((IVar1 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) != 0)) {
    return;
  }
  if (IVar1 == ConstId) {
    return;
  }
LAB_0089915f:
  if (curr->_id == TupleMakeId) {
    uVar4 = curr[1].type.id;
    if (uVar4 == 0) {
      return;
    }
    uVar10 = 0;
    while( true ) {
      for (pbVar11 = *(byte **)(*(long *)(curr + 1) + uVar10 * 8); bVar2 = *pbVar11, bVar2 == 0x51;
          pbVar11 = *(byte **)(pbVar11 + 0x18)) {
        if (1 < *(int *)(pbVar11 + 0x10) - 1U) goto LAB_008991c8;
      }
      if (((0x2a < bVar2 - 0x29) || ((0x40000000005U >> ((ulong)(bVar2 - 0x29) & 0x3f) & 1) == 0))
         && (bVar2 != 0xe)) break;
      uVar10 = uVar10 + 1;
      if (uVar10 == uVar4) {
        return;
      }
    }
  }
LAB_008991c8:
  if ((6 < uVar3 & (byte)uVar3) != 0) {
    return;
  }
  getContents((PossibleContents *)local_50,this,curr);
  pPVar5 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
           ).super_Pass.runner;
  wasm = (this->
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
         .currModule;
  TVar8 = PossibleContents::getType((PossibleContents *)local_50);
  options = &pPVar5->options;
  if (TVar8.id == 1) {
    pEVar9 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x10,8);
    pEVar9->_id = UnreachableId;
    (pEVar9->type).id = 1;
    pEVar9 = getDroppedChildrenAndAppend(curr,wasm,options,pEVar9,NoticeParentEffects);
    replaceCurrent(this,pEVar9);
  }
  else {
    if ((1 < (byte)(contents.value.
                    super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    ._M_u._16_1_ - 1)) ||
       (MVar7 = Properties::getMemoryOrder(curr), MVar7 != Unordered)) goto LAB_00899265;
    pEVar9 = PossibleContents::makeExpression((PossibleContents *)local_50,wasm);
    bVar6 = wasm::Type::isSubType((Type)(pEVar9->type).id,(Type)(curr->type).id);
    if (!bVar6) {
      bVar6 = Properties::isConstantExpression(pEVar9);
      if (!bVar6) {
        if (pEVar9->_id != GlobalGetId) {
          __assert_fail("c->is<GlobalGet>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GUFA.cpp"
                        ,0xd1,
                        "void wasm::(anonymous namespace)::GUFAOptimizer::visitExpression(Expression *)"
                       );
        }
        goto LAB_00899265;
      }
      pEVar9 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x10,8);
      pEVar9->_id = UnreachableId;
      (pEVar9->type).id = 1;
    }
    pEVar9 = getDroppedChildrenAndAppend(curr,wasm,options,pEVar9,NoticeParentEffects);
    replaceCurrent(this,pEVar9);
  }
  this->optimized = true;
LAB_00899265:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)local_50);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Skip things we can't improve in any way.
    auto type = curr->type;
    if (type == Type::unreachable || type == Type::none ||
        Properties::isConstantExpression(curr)) {
      return;
    }

    if (type.isTuple()) {
      // TODO: tuple types.
      return;
    }

    // Ok, this is an interesting location that we might optimize. See what the
    // oracle says is possible there.
    auto contents = getContents(curr);

    auto& options = getPassOptions();
    auto& wasm = *getModule();
    Builder builder(wasm);

    if (contents.getType() == Type::unreachable) {
      // This cannot contain any possible value at all. It must be unreachable
      // code.
      replaceCurrent(getDroppedChildrenAndAppend(
        curr, wasm, options, builder.makeUnreachable()));
      optimized = true;
      return;
    }

    // This is reachable. Check if we can emit something optimized for it.
    // TODO: can we handle more general things here too?
    if (!contents.canMakeExpression()) {
      return;
    }

    if (Properties::getMemoryOrder(curr) != MemoryOrder::Unordered) {
      // This load might synchronize with some store, and if we replaced the
      // load with a constant or with a load from a global, it would not
      // synchronize with that store anymore.
      return;
    }

    auto* c = contents.makeExpression(wasm);

    // We can only place the constant value here if it has the right type. For
    // example, a block may return (ref any), that is, not allow a null, but in
    // practice only a null may flow there if it goes through casts that will
    // trap at runtime.
    // TODO: GUFA should eventually do this, but it will require it properly
    //       filtering content not just on ref.cast as it does now, but also
    //       ref.as etc. Once it does those we could assert on the type being
    //       valid here.
    if (Type::isSubType(c->type, curr->type)) {
      replaceCurrent(getDroppedChildrenAndAppend(curr, wasm, options, c));
      optimized = true;
    } else {
      // The type is not compatible: we cannot place |c| in this location, even
      // though we have proven it is the only value possible here.
      if (Properties::isConstantExpression(c)) {
        // The type is not compatible and this is a simple constant expression
        // like a ref.func. That means this code must be unreachable. (See below
        // for the case of a non-constant.)
        replaceCurrent(getDroppedChildrenAndAppend(
          curr, wasm, options, builder.makeUnreachable()));
        optimized = true;
      } else {
        // This is not a constant expression, but we are certain it is the right
        // value. Atm the only such case we handle is a global.get of an
        // immutable global. We don't know what the value will be, nor its
        // specific type, but we do know that a global.get will get that value
        // properly. However, in this case it does not have the right type for
        // this location. That can happen since the global.get does not have
        // exactly the proper type for the contents: the global.get might be
        // nullable, for example, even though the contents are not actually a
        // null. For example, consider what happens here:
        //
        //  (global $foo (ref null any) (struct.new $Foo))
        //  ..
        //    (ref.as_non_null
        //      (global.get $foo))
        //
        // We create a $Foo in the global $foo, so its value is not a null. But
        // the global's type is nullable, so the global.get's type will be as
        // well. When we get to the ref.as_non_null, we then want to replace it
        // with a global.get - in fact that's what its child already is, showing
        // it is the right content for it - but that global.get would not have a
        // non-nullable type like a ref.as_non_null must have, so we cannot
        // simply replace it.
        //
        // For now, do nothing here, but in some cases we could probably
        // optimize (e.g. by adding a ref.as_non_null in the example) TODO
        assert(c->is<GlobalGet>());
      }
    }
  }